

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_service.cpp
# Opt level: O2

void __thiscall
booster::aio::event_loop_impl::post(event_loop_impl *this,event_handler *h,error_code *e)

{
  lock_guard l;
  unique_lock<std::recursive_mutex> local_50;
  completion_handler local_40;
  
  std::unique_lock<std::recursive_mutex>::unique_lock(&local_50,&this->data_mutex_);
  completion_handler::completion_handler(&local_40,h,e);
  std::
  deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
  ::emplace_back<booster::aio::event_loop_impl::completion_handler>
            (&this->dispatch_queue_,&local_40);
  intrusive_ptr<booster::refcounted>::~intrusive_ptr(&local_40.h);
  if (this->polling_ == true) {
    impl::select_interrupter::notify(&this->interrupter_);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_50);
  return;
}

Assistant:

void post(event_handler const &h,booster::system::error_code const &e)
	{
		lock_guard l(data_mutex_);
		dispatch_queue_.push_back(completion_handler(h,e));
		if(polling_)
			wake();
	}